

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.h
# Opt level: O1

shared_ptr<chrono::fea::ChNodeFEAbase> __thiscall
chrono::fea::ChElementShellBST::GetNodeN(ChElementShellBST *this,int n)

{
  int iVar1;
  _func_int **pp_Var2;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar4;
  shared_ptr<chrono::fea::ChNodeFEAbase> sVar5;
  
  iVar1 = *(int *)(CONCAT44(in_register_00000034,n) + 0x5c + (long)in_EDX * 4);
  _Var3._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (CONCAT44(in_register_00000034,n) + 0x78);
  (this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       _Var3._M_pi[iVar1]._vptr__Sp_counted_base;
  pp_Var2 = *(_func_int ***)&_Var3._M_pi[iVar1]._M_use_count;
  (this->super_ChElementShell).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock = pp_Var2;
  if (pp_Var2 != (_func_int **)0x0) {
    _Var3._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
      sVar4.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar4.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<chrono::fea::ChNodeFEAbase>)
             sVar4.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    *(int *)(pp_Var2 + 1) = *(int *)(pp_Var2 + 1) + 1;
    UNLOCK();
  }
  sVar5.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  sVar5.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::fea::ChNodeFEAbase>)
         sVar5.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<ChNodeFEAbase> GetNodeN(int n) override { return m_nodes[nodes_used_to_six[n]]; }